

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O0

int INT_EVclient_shutdown(EVclient client,int result)

{
  int iVar1;
  __pid_t _Var2;
  long lVar3;
  pthread_t pVar4;
  int in_ESI;
  CMConnection in_RDI;
  EVmaster_msg_type unaff_retaddr;
  void *in_stack_00000008;
  EVmaster in_stack_00000010;
  timespec ts_2;
  timespec ts_1;
  timespec ts;
  EVshutdown_contribution_msg msg;
  CMFormat shutdown_msg;
  CMConnection in_stack_ffffffffffffff78;
  FILE *pFVar5;
  CManager_conflict in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff90;
  int line;
  char *in_stack_ffffffffffffff98;
  CManager in_stack_ffffffffffffffa0;
  __time_t local_50;
  undefined4 local_48;
  CMTraceType in_stack_ffffffffffffffbc;
  CManager in_stack_ffffffffffffffc0;
  long local_38;
  timespec local_30;
  CMFormat local_18;
  
  line = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  local_18 = INT_CMlookup_format(in_RDI->cm,EVclient_shutdown_contribution_format_list);
  if (in_RDI->handshake_condition != 0) {
    printf("Node %d, already shut down BAD!\n",(ulong)*(uint *)&in_RDI->preloaded_formats);
  }
  iVar1 = CMtrace_val[0xd];
  if (in_RDI->cm->CMTrace_file == (FILE *)0x0) {
    iVar1 = CMtrace_init(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  }
  if (iVar1 != 0) {
    if (CMtrace_PID != 0) {
      in_stack_ffffffffffffffa0 = (CManager)in_RDI->cm->CMTrace_file;
      _Var2 = getpid();
      pVar4 = pthread_self();
      fprintf((FILE *)in_stack_ffffffffffffffa0,"P%lxT%lx - ",(long)_Var2,pVar4);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,&local_30);
      fprintf((FILE *)in_RDI->cm->CMTrace_file,"%lld.%.9ld - ",local_30.tv_sec,local_30.tv_nsec);
    }
    fprintf((FILE *)in_RDI->cm->CMTrace_file,"Client %d calling client_shutdown\n",
            (ulong)*(uint *)&in_RDI->preloaded_formats);
  }
  fflush((FILE *)in_RDI->cm->CMTrace_file);
  if (in_RDI->io_out_buffer == (FFSBuffer)0x0) {
    queue_master_msg(in_stack_00000010,in_stack_00000008,unaff_retaddr,in_RDI,in_ESI);
  }
  else {
    INT_CMwrite((CMConnection)in_stack_ffffffffffffff80,(CMFormat)in_stack_ffffffffffffff78,
                (void *)0x15e503);
  }
  if (in_RDI->handshake_condition == 0) {
    IntCManager_unlock(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,line);
    iVar1 = CMtrace_val[0xd];
    if (in_RDI->cm->CMTrace_file == (FILE *)0x0) {
      iVar1 = CMtrace_init(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    }
    if (iVar1 != 0) {
      if (CMtrace_PID != 0) {
        pFVar5 = (FILE *)in_RDI->cm->CMTrace_file;
        _Var2 = getpid();
        in_stack_ffffffffffffff98 = (char *)(long)_Var2;
        pVar4 = pthread_self();
        fprintf(pFVar5,"P%lxT%lx - ",in_stack_ffffffffffffff98,pVar4);
        line = (int)((ulong)pFVar5 >> 0x20);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)&stack0xffffffffffffffc0);
        fprintf((FILE *)in_RDI->cm->CMTrace_file,"%lld.%.9ld - ",in_stack_ffffffffffffffc0,local_38)
        ;
      }
      fprintf((FILE *)in_RDI->cm->CMTrace_file,"Client %d shutdown condition wait\n",
              (ulong)*(uint *)&in_RDI->preloaded_formats);
    }
    fflush((FILE *)in_RDI->cm->CMTrace_file);
    new_shutdown_condition((EVclient)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    CMCondition_wait(in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    iVar1 = CMtrace_val[0xd];
    if (in_RDI->cm->CMTrace_file == (FILE *)0x0) {
      iVar1 = CMtrace_init(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    }
    if (iVar1 != 0) {
      if (CMtrace_PID != 0) {
        pFVar5 = (FILE *)in_RDI->cm->CMTrace_file;
        _Var2 = getpid();
        lVar3 = (long)_Var2;
        pVar4 = pthread_self();
        fprintf(pFVar5,"P%lxT%lx - ",lVar3,pVar4);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)&local_50);
        fprintf((FILE *)in_RDI->cm->CMTrace_file,"%lld.%.9ld - ",local_50,
                CONCAT44(in_stack_ffffffffffffffbc,local_48));
      }
      fprintf((FILE *)in_RDI->cm->CMTrace_file,"Client %d shutdown condition wait DONE!\n",
              (ulong)*(uint *)&in_RDI->preloaded_formats);
    }
    fflush((FILE *)in_RDI->cm->CMTrace_file);
    IntCManager_lock(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,line);
  }
  return in_RDI->conn_ref_count;
}

Assistant:

extern int
INT_EVclient_shutdown(EVclient client, int result)
{
    CMFormat shutdown_msg = INT_CMlookup_format(client->cm, EVclient_shutdown_contribution_format_list);
    EVshutdown_contribution_msg msg;
    if (client->already_shutdown) printf("Node %d, already shut down BAD!\n", client->my_node_id);
    msg.value = result;
    CMtrace_out(client->cm, EVdfgVerbose, "Client %d calling client_shutdown\n", client->my_node_id);
    if (client->master_connection == NULL) {
	queue_master_msg(client->master, (void*)&msg, DFGshutdown_contrib, NULL, /*copy*/0);
    } else {
	/* we are a client, tell the master to shutdown */
	INT_CMwrite(client->master_connection, shutdown_msg, &msg);
    }
    if (!client->already_shutdown) {
	CManager_unlock(client->cm);
	CMtrace_out(client->cm, EVdfgVerbose, "Client %d shutdown condition wait\n", client->my_node_id);
	CMCondition_wait(client->cm, new_shutdown_condition(client, client->master_connection));
	CMtrace_out(client->cm, EVdfgVerbose, "Client %d shutdown condition wait DONE!\n", client->my_node_id);
	CManager_lock(client->cm);
    }
    return client->shutdown_value;
}